

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

void __thiscall
ON_SubDMeshFragment::Internal_LayoutArrays
          (ON_SubDMeshFragment *this,size_t vertex_capacity,double *PNTKC_array)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  double *local_80;
  long local_78;
  size_t stride_C;
  size_t offset_K;
  size_t stride_K;
  size_t offset_PNT;
  size_t stride_PNT;
  bool bInterlaced;
  unsigned_short etc;
  size_t double_capacity;
  double *pdStack_20;
  bool bManagedArray;
  double *PNTKC_array_local;
  size_t vertex_capacity_local;
  ON_SubDMeshFragment *this_local;
  
  pdStack_20 = PNTKC_array;
  if (3 < vertex_capacity && PNTKC_array == (double *)0x0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = vertex_capacity * 0xc;
    uVar4 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pdStack_20 = (double *)operator_new__(uVar4,(nothrow_t *)&std::nothrow);
  }
  SetVertexCount(this,0);
  if (((pdStack_20 == (double *)0x0) || (vertex_capacity < 4)) ||
     (PNTKC_array_local = (double *)vertex_capacity, 0x1000 < vertex_capacity)) {
    pdStack_20 = (double *)0x0;
    PNTKC_array_local = (double *)0x0;
  }
  if (3 < vertex_capacity && PNTKC_array == (double *)0x0) {
    uVar1 = this->m_vertex_capacity_etc;
    this->m_vertex_capacity_etc = (unsigned_short)PNTKC_array_local;
    this->m_vertex_capacity_etc = this->m_vertex_capacity_etc | uVar1 & 0xe000 | 0x8000;
  }
  else {
    SetUnmanagedVertexCapacityForExperts(this,(size_t)PNTKC_array_local);
  }
  iVar3 = 0;
  if (pdStack_20 != (double *)0x0) {
    iVar3 = 3;
  }
  sVar5 = (size_t)iVar3;
  if (pdStack_20 == (double *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = (long)PNTKC_array_local * 3;
  }
  if (pdStack_20 == (double *)0x0) {
    local_80 = (double *)0x0;
  }
  else {
    local_80 = PNTKC_array_local;
  }
  this->m_P = pdStack_20;
  this->m_P_stride = sVar5;
  this->m_N = this->m_P + local_78;
  this->m_N_stride = sVar5;
  this->m_T = this->m_N + local_78;
  this->m_T_stride = sVar5;
  this->m_K = (ON_SurfaceCurvature *)(this->m_T + local_78);
  this->m_K_stride = (ulong)(pdStack_20 != (double *)0x0);
  this->m_C = (ON_Color *)(this->m_K + (long)local_80);
  this->m_C_stride = (ulong)(pdStack_20 != (double *)0x0);
  return;
}

Assistant:

void ON_SubDMeshFragment::Internal_LayoutArrays(
  size_t vertex_capacity,
  double* PNTKC_array
)
{
  const bool bManagedArray = (vertex_capacity >= 4 && nullptr == PNTKC_array);
  if (bManagedArray)
  {
    const size_t double_capacity = ON_SubDMeshFragment::DoublesPerVertex * vertex_capacity;
    // PNTKC_array will be deleted in ON_SubDMeshFragment::DeleteManagedArrays().
    PNTKC_array = new(std::nothrow) double[double_capacity];
  }


  this->SetVertexCount(0);

  if (nullptr == PNTKC_array || vertex_capacity < 4 || vertex_capacity > ((size_t)ON_SubDMeshFragment::MaximumVertexCount) )
  {
    PNTKC_array = nullptr;
    vertex_capacity = 0;
  }
  if (bManagedArray)
  {
    unsigned short etc = (m_vertex_capacity_etc & ON_SubDMeshFragment::EtcMask);
    etc |= ON_SubDMeshFragment::EtcManagedArraysBit;
    m_vertex_capacity_etc = (unsigned short)vertex_capacity;
    m_vertex_capacity_etc |= etc;
  }
  else
  {
    this->SetUnmanagedVertexCapacityForExperts(vertex_capacity);
  }

  // If needed, bInterlaced can become a parameter in this private function.
  // bInterlaced - [in]  
  //   True if the points, normals, textures, colors, and curvatures should be interlaced.
  //   False if the points, normals, textures, colors, and curvatures should be in
  //   contiguous memory.
  const bool bInterlaced = false;

  // stride_PNT = number of double elements to get from m_P[i] to m_P[i+1] (dittof for m_N[] and m_T[])
  const size_t stride_PNT
    = (nullptr != PNTKC_array)
    ? (bInterlaced ? ON_SubDMeshFragment::DoublesPerVertex : 3)
    : 0;

  // offset_PNT = offset between start of m_P, m_N, m_T, m_K
  const size_t offset_PNT
    = (nullptr != PNTKC_array)
    ? 3 * (bInterlaced ? 1 : vertex_capacity)
    : 0;

  // stride_K = number of ON_SubDSurfaceCurvature elements to get from m_K[i] to m_K[i+1]
  const size_t stride_K
    = (nullptr != PNTKC_array)
    ? (bInterlaced ? (ON_SubDMeshFragment::DoublesPerVertex * sizeof(double)) / sizeof(m_K[0]) : 1)
    : 0;

  // offset_K = offset between m_K and m_C
  const size_t offset_K
    = (nullptr != PNTKC_array)
    ? (bInterlaced ? 1 : vertex_capacity)
    : 0;

  // stride_C = number of ON_Color elements to get from m_C[i] to m_C[i+1]
  const size_t stride_C
    = (nullptr != PNTKC_array)
    ? (bInterlaced ? (ON_SubDMeshFragment::DoublesPerVertex * sizeof(double)) / sizeof(m_C[0]) : 1)
    : 0;

  m_P = PNTKC_array;
  m_P_stride = stride_PNT;

  m_N = m_P + offset_PNT;
  m_N_stride = stride_PNT;

  m_T = m_N + offset_PNT;
  m_T_stride = stride_PNT;

  m_K = (ON_SurfaceCurvature*)(m_T + offset_PNT);
  m_K_stride = stride_K;

  m_C = (ON_Color*)(m_K + offset_K);
  m_C_stride = stride_C;
}